

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::SendProxyMessage
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aDstAddr,string *aUriPath)

{
  ErrorCode EVar1;
  int iVar2;
  Error *pEVar3;
  function<void_(ot::commissioner::Error)> *this_00;
  undefined1 local_1b0 [40];
  Address dstAddr;
  Error error;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  Tlv local_120;
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_e0 [40];
  Request request;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coap::Message::Message(&request,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function(&onResponse.aHandler,aHandler);
  Address::Set((Error *)local_1b0,&dstAddr,aDstAddr);
  pEVar3 = Error::operator=(&error,(Error *)local_1b0);
  EVar1 = pEVar3->mCode;
  std::__cxx11::string::~string((string *)(local_1b0 + 8));
  if (EVar1 == kNone) {
    coap::Message::SetUriPath((Error *)local_1b0,&request,aUriPath);
    pEVar3 = Error::operator=(&error,(Error *)local_1b0);
    EVar1 = pEVar3->mCode;
    std::__cxx11::string::~string((string *)(local_1b0 + 8));
    if (EVar1 == kNone) {
      iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[7])(this);
      tlv::Tlv::Tlv(&local_120,kCommissionerSessionId,(uint16_t)iVar2,kMeshCoP);
      AppendTlv((Error *)local_1b0,&request,&local_120);
      pEVar3 = Error::operator=(&error,(Error *)local_1b0);
      EVar1 = pEVar3->mCode;
      std::__cxx11::string::~string((string *)(local_1b0 + 8));
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&local_120.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                );
      if (EVar1 == kNone) {
        iVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
        if ((char)iVar2 != '\0') {
          SignRequest((Error *)local_1b0,this,&request,kMeshCoP,true);
          pEVar3 = Error::operator=(&error,(Error *)local_1b0);
          EVar1 = pEVar3->mCode;
          std::__cxx11::string::~string((string *)(local_1b0 + 8));
          if (EVar1 != kNone) goto LAB_00176394;
        }
        local_138 = (code *)0x0;
        pcStack_130 = (code *)0x0;
        local_148._M_unused._M_object = (void *)0x0;
        local_148._8_8_ = 0;
        this_00 = (function<void_(ot::commissioner::Error)> *)operator_new(0x20);
        std::function<void_(ot::commissioner::Error)>::function(this_00,&onResponse.aHandler);
        pcStack_130 = std::
                      _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:2403:23)>
                      ::_M_invoke;
        local_138 = std::
                    _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:2403:23)>
                    ::_M_manager;
        local_148._M_unused._M_object = this_00;
        ProxyClient::SendRequest
                  (&this->mProxyClient,&request,(ResponseHandler *)&local_148,&dstAddr,0xf0bf);
        std::_Function_base::~_Function_base((_Function_base *)&local_148);
      }
    }
  }
LAB_00176394:
  if (error.mCode != kNone) {
    Error::Error((Error *)local_e0,&error);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,(Error *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
  }
  std::_Function_base::~_Function_base((_Function_base *)&onResponse);
  coap::Message::~Message(&request);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dstAddr);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::SendProxyMessage(ErrorHandler aHandler, const std::string &aDstAddr, const std::string &aUriPath)
{
    Error         error;
    Address       dstAddr;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError, /* aStateTlvIsMandatory */ false));
    };

    SuccessOrExit(error = dstAddr.Set(aDstAddr));

    SuccessOrExit(error = request.SetUriPath(aUriPath));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}